

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.hpp
# Opt level: O3

double __thiscall
duckdb::WindowCursor::GetCell<double>(WindowCursor *this,idx_t col_idx,idx_t row_idx)

{
  pointer this_00;
  ulong uVar1;
  reference pvVar2;
  
  uVar1 = (this->state).current_row_index;
  if ((this->state).next_row_index <= row_idx || row_idx < uVar1) {
    this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(&this->paged->inputs);
    ColumnDataCollection::Seek(this_00,row_idx,&this->state,&this->chunk);
    uVar1 = (this->state).current_row_index;
  }
  pvVar2 = vector<duckdb::Vector,_true>::operator[](&(this->chunk).data,col_idx);
  return *(double *)(pvVar2->data + (ulong)(uint)((int)row_idx - (int)uVar1) * 8);
}

Assistant:

T GetCell(idx_t col_idx, idx_t row_idx) {
		D_ASSERT(chunk.ColumnCount() > col_idx);
		auto index = Seek(row_idx);
		auto &source = chunk.data[col_idx];
		const auto data = FlatVector::GetData<T>(source);
		return data[index];
	}